

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

var __thiscall cs::struct_builder::operator()(struct_builder *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  type_t *ptVar5;
  undefined4 extraout_var_00;
  structure *psVar6;
  domain_type *args_2;
  runtime_error *prVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  context_t *in_RSI;
  type_info *ptVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  element_type *peVar11;
  var parent;
  allocator local_c1;
  var builder;
  scope_guard scope;
  string local_b0 [4];
  
  scope_guard::scope_guard(&scope,in_RSI);
  peVar11 = in_RSI[4].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar11 != (element_type *)0x0) {
    local_b0[0]._M_dataplus._M_p = (pointer)peVar11;
    runtime_type::parse_expr
              ((runtime_type *)&builder,
               (iterator *)
               (((in_RSI->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(local_b0,0));
    if (builder.mDat == (proxy *)0x0) {
      ptVar9 = (type_info *)&void::typeinfo;
    }
    else {
      iVar4 = (*(builder.mDat)->data->_vptr_baseHolder[2])();
      ptVar9 = (type_info *)CONCAT44(extraout_var,iVar4);
    }
    bVar3 = std::type_info::operator==(ptVar9,(type_info *)&type_t::typeinfo);
    if (!bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)local_b0,"Target is not a type.",(allocator *)&parent);
      runtime_error::runtime_error(prVar7,local_b0);
      __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    ptVar5 = cs_impl::any::const_val<cs::type_t>(&builder);
    bVar3 = type_id::compare((type_id *)(in_RSI + 1),&ptVar5->id);
    if (bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)local_b0,"Can not inherit itself.",(allocator *)&parent);
      runtime_error::runtime_error(prVar7,local_b0);
      __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    std::function<cs_impl::any_()>::operator()((function<cs_impl::any_()> *)&parent);
    if (parent.mDat == (proxy *)0x0) {
      ptVar9 = (type_info *)&void::typeinfo;
    }
    else {
      iVar4 = (*(parent.mDat)->data->_vptr_baseHolder[2])();
      ptVar9 = (type_info *)CONCAT44(extraout_var_00,iVar4);
    }
    bVar3 = std::type_info::operator==(ptVar9,(type_info *)&structure::typeinfo);
    if (!bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)local_b0,"Target is not a struct.",&local_c1);
      runtime_error::runtime_error(prVar7,local_b0);
      __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    cs_impl::any::protect(&parent);
    peVar1 = (((in_RSI->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar6 = cs_impl::any::const_val<cs::structure>(&parent);
    domain_manager::involve_domain
              (&(peVar1->super_runtime_type).storage,
               (psVar6->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,false);
    domain_manager::add_var_no_return<char_const(&)[7]>
              (&(((((in_RSI->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage,(char (*) [7])"parent",&parent,true);
    cs_impl::any::recycle(&parent);
    cs_impl::any::recycle(&builder);
  }
  p_Var10 = in_RSI[5].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  p_Var8 = in_RSI[6].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  peVar11 = in_RSI[7].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = in_RSI[7].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  while (p_Var10 != p_Var2) {
    statement_base::run((statement_base *)p_Var10->_vptr__Sp_counted_base);
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var10->_M_use_count;
    if (p_Var10 == p_Var8) {
      p_Var10 = (peVar11->compiler).
                super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      peVar11 = (element_type *)
                &(peVar11->compiler).
                 super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      p_Var8 = p_Var10 + 0x20;
    }
  }
  args_2 = scope_guard::get(&scope);
  cs_impl::any::make<cs::structure,cs::type_id&,std::__cxx11::string&,cs::domain_type_const&>
            ((any *)this,(type_id *)(in_RSI + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 2),
             args_2);
  scope_guard::~scope_guard(&scope);
  return (var)(proxy *)this;
}

Assistant:

var struct_builder::operator()()
	{
		scope_guard scope(mContext);
		if (mParent.root().usable()) {
			var builder = mContext->instance->parse_expr(mParent.root());
			if (builder.type() == typeid(type_t)) {
				const auto &t = builder.const_val<type_t>();
				if (mTypeId == t.id)
					throw runtime_error("Can not inherit itself.");
				var parent = t.constructor();
				if (parent.type() == typeid(structure)) {
					parent.protect();
					mContext->instance->storage.involve_domain(parent.const_val<structure>().get_domain());
					mContext->instance->storage.add_var_no_return("parent", parent, true);
				}
				else
					throw runtime_error("Target is not a struct.");
			}
			else
				throw runtime_error("Target is not a type.");
		}
		for (auto &ptr: this->mMethod) {
			try {
				ptr->run();
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
		}
		return var::make<structure>(this->mTypeId, this->mName, scope.get());
	}